

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

BOOL __thiscall
Js::TypedArray<double,_false,_true>::BaseTypedDirectSetItem
          (TypedArray<double,_false,_true> *this,uint32 index,Var value,
          _func_double_Var_ScriptContext_ptr *convFunc)

{
  uint uVar1;
  ArrayBufferBase *pAVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  double dVar8;
  
  dVar8 = (*convFunc)(value,(((((this->super_TypedArrayBase).super_ArrayBufferParent.
                                super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.
                               ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                            scriptContext.ptr);
  pAVar2 = (this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr;
  if (pAVar2->isDetached == true) {
    JavascriptError::ThrowTypeError
              ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  BVar5 = 0;
  if (index < (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length) {
    uVar1 = (this->super_TypedArrayBase).byteOffset;
    uVar6 = (*(pAVar2->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar6 < (ulong)uVar1 + (ulong)index * 8 + 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x1ca,
                                  "((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    *(double *)((this->super_TypedArrayBase).buffer + (ulong)index * 8) = dVar8;
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

inline BOOL BaseTypedDirectSetItem(__in uint32 index, __in Js::Var value, TypeName (*convFunc)(Var value, ScriptContext* scriptContext))
        {
            // This call can potentially invoke user code, and may end up detaching the underlying array (this).
            // Therefore it was brought out and above the IsDetached check
            TypeName typedValue = convFunc(value, GetScriptContext());

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            if (index >= GetLength())
            {
                return FALSE;
            }

            AssertMsg(index < GetLength(), "Trying to set out of bound index for typed array.");
            Assert((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            TypeName* typedBuffer = (TypeName*)buffer;

            typedBuffer[index] = typedValue;

            return TRUE;
        }